

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  undefined8 *puVar2;
  ImVector<unsigned_int> *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  char cVar7;
  char cVar8;
  byte bVar9;
  ImDrawCmd *pIVar10;
  ImDrawChannel *pIVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined8 uVar22;
  ImGuiContext *pIVar23;
  int n;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  ImDrawChannel *pIVar27;
  int *piVar28;
  ulong uVar29;
  char *__function;
  uint uVar30;
  int iVar31;
  ImBitArray<132> *pIVar32;
  ImGuiTableColumn *pIVar33;
  ImDrawChannel *pIVar34;
  float *pfVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  bool bVar39;
  uint uVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  ImBitArray<132> remaining_mask;
  MergeGroup merge_groups [4];
  float local_158;
  ImBitArray<132> local_128;
  float local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8 [2];
  undefined8 local_d0;
  int iStack_c8;
  ImBitArray<132> local_c4 [7];
  
  pIVar23 = GImGui;
  cVar7 = table->FreezeRowsCount;
  cVar8 = table->FreezeColumnsCount;
  lVar25 = 0;
  do {
    *(undefined8 *)((long)local_d8 + lVar25) = 0;
    *(undefined8 *)((long)&local_d0 + lVar25) = 0;
    lVar25 = lVar25 + 0x28;
  } while (lVar25 != 0xa0);
  uVar30 = 0;
  memset(local_d8,0,0xa0);
  if (0 < table->ColumnsCount) {
    uVar29 = 0;
    do {
      if ((table->VisibleUnclippedMaskByIndex >> (uVar29 & 0x3f) & 1) != 0) {
        pIVar33 = (table->Columns).Data + uVar29;
        if ((table->Columns).DataEnd <= pIVar33) {
          __assert_fail("p >= Data && p < DataEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_internal.h"
                        ,0x217,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]"
                       );
        }
        iVar36 = 0;
        do {
          bVar9 = *(byte *)((long)pIVar33 + (0x65 - (ulong)(iVar36 == 0)));
          if ((table->DrawSplitter)._Channels.Size <= (int)(uint)bVar9) goto LAB_002c3e21;
          pIVar27 = (table->DrawSplitter)._Channels.Data;
          pIVar34 = pIVar27 + bVar9;
          iVar31 = pIVar27[bVar9]._CmdBuffer.Size;
          if ((0 < (long)iVar31) && ((pIVar34->_CmdBuffer).Data[(long)iVar31 + -1].ElemCount == 0))
          {
            (pIVar34->_CmdBuffer).Size = iVar31 + -1;
          }
          if ((pIVar34->_CmdBuffer).Size == 1) {
            if ((pIVar33->Flags & 0x100) == 0) {
              if (cVar7 < '\x01') {
                fVar41 = pIVar33->ContentMaxXUnfrozen;
LAB_002c3843:
                uVar40 = -(uint)(pIVar33->ContentMaxXHeadersUsed <= fVar41);
                fVar41 = (float)(~uVar40 & (uint)pIVar33->ContentMaxXHeadersUsed |
                                (uint)fVar41 & uVar40);
              }
              else {
                if (iVar36 == 0) {
                  fVar41 = pIVar33->ContentMaxXFrozen;
                  goto LAB_002c3843;
                }
                fVar41 = pIVar33->ContentMaxXUnfrozen;
              }
              pIVar1 = &(pIVar33->ClipRect).Max;
              if (pIVar1->x <= fVar41 && fVar41 != pIVar1->x) goto LAB_002c394f;
            }
            if (cVar8 < '\x01') {
              uVar40 = 1;
            }
            else {
              uVar40 = (uint)((long)table->FreezeColumnsCount <= (long)uVar29);
            }
            uVar24 = (uint)(iVar36 != 0) * 2;
            if (cVar7 < '\x01') {
              uVar24 = 2;
            }
            if (0x83 < bVar9) {
              __assert_fail("channel_no < (4 + 64 * 2)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                            ,0x26bd,"void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *)");
            }
            uVar26 = (ulong)(uVar40 | uVar24);
            pfVar35 = local_d8 + uVar26 * 10;
            if ((&iStack_c8)[uVar26 * 10] == 0) {
              pfVar35[0] = 3.4028235e+38;
              pfVar35[1] = 3.4028235e+38;
              (&local_d0)[uVar26 * 5] = 0xff7fffffff7fffff;
            }
            ImBitArray<132>::SetBit(local_c4 + uVar26 * 2,(uint)bVar9);
            (&iStack_c8)[uVar26 * 10] = (&iStack_c8)[uVar26 * 10] + 1;
            if ((pIVar34->_CmdBuffer).Size < 1) {
              __function = "T &ImVector<ImDrawCmd>::operator[](int) [T = ImDrawCmd]";
              goto LAB_002c3e8b;
            }
            pIVar10 = (pIVar34->_CmdBuffer).Data;
            fVar41 = (pIVar10->ClipRect).x;
            fVar4 = (pIVar10->ClipRect).y;
            fVar5 = (pIVar10->ClipRect).z;
            fVar6 = (pIVar10->ClipRect).w;
            if (fVar41 < *pfVar35) {
              *pfVar35 = fVar41;
            }
            if (fVar4 < local_d8[uVar26 * 10 + 1]) {
              local_d8[uVar26 * 10 + 1] = fVar4;
            }
            if (*(float *)(&local_d0 + uVar26 * 5) <= fVar5 &&
                fVar5 != *(float *)(&local_d0 + uVar26 * 5)) {
              *(float *)(&local_d0 + uVar26 * 5) = fVar5;
            }
            pfVar35 = (float *)((long)&local_d0 + uVar26 * 0x28 + 4);
            if (*pfVar35 <= fVar6 && fVar6 != *pfVar35) {
              *(float *)((long)&local_d0 + uVar26 * 0x28 + 4) = fVar6;
            }
            uVar30 = uVar30 | 1 << (uVar40 | uVar24);
          }
LAB_002c394f:
          bVar39 = iVar36 == 0;
          iVar36 = iVar36 + -1;
        } while (('\0' < cVar7) && (bVar39));
        pIVar33->DrawChannelCurrent = 0xff;
      }
      uVar29 = uVar29 + 1;
    } while ((long)uVar29 < (long)table->ColumnsCount);
    if (uVar30 != 0) {
      iVar31 = (table->DrawSplitter)._Count + -2;
      iVar36 = (pIVar23->DrawChannelsTempMergeBuffer).Capacity;
      if (iVar36 < iVar31) {
        if (iVar36 == 0) {
          iVar37 = 8;
        }
        else {
          iVar37 = iVar36 / 2 + iVar36;
        }
        if (iVar37 <= iVar31) {
          iVar37 = iVar31;
        }
        if (iVar36 < iVar37) {
          pIVar27 = (ImDrawChannel *)MemAlloc((long)iVar37 << 5);
          pIVar34 = (pIVar23->DrawChannelsTempMergeBuffer).Data;
          if (pIVar34 != (ImDrawChannel *)0x0) {
            memcpy(pIVar27,pIVar34,(long)(pIVar23->DrawChannelsTempMergeBuffer).Size << 5);
            MemFree((pIVar23->DrawChannelsTempMergeBuffer).Data);
          }
          (pIVar23->DrawChannelsTempMergeBuffer).Data = pIVar27;
          (pIVar23->DrawChannelsTempMergeBuffer).Capacity = iVar37;
        }
      }
      (pIVar23->DrawChannelsTempMergeBuffer).Size = iVar31;
      pIVar34 = (pIVar23->DrawChannelsTempMergeBuffer).Data;
      local_128.Storage[0] = 0;
      local_128.Storage[1] = 0;
      local_128.Storage[2] = 0;
      local_128.Storage[3] = 0;
      local_128.Storage[4] = 0;
      ImBitArray<132>::SetBitRange(&local_128,2,(table->DrawSplitter)._Count + -1);
      ImBitArray<132>::ClearBit(&local_128,(uint)table->Bg1DrawChannelUnfrozen);
      if (cVar7 < '\x01') {
        iVar36 = -2;
      }
      else {
        iVar36 = -3;
        if (table->Bg1DrawChannelUnfrozen == '\x01') {
          __assert_fail("has_freeze_v == false || table->Bg1DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG1_FROZEN"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                        ,0x26e9,"void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *)");
        }
      }
      iVar36 = iVar36 + (table->DrawSplitter)._Count;
      fVar41 = (table->HostClipRect).Min.x;
      fVar4 = (table->HostClipRect).Min.y;
      local_f8 = ZEXT416((uint)(table->HostClipRect).Max.x);
      local_108 = (table->HostClipRect).Max.y;
      uStack_104 = 0;
      uStack_100 = 0;
      uStack_fc = 0;
      pIVar32 = local_c4;
      uVar29 = 0;
      do {
        iVar31 = (&iStack_c8)[uVar29 * 10];
        if (iVar31 != 0) {
          fVar5 = local_d8[uVar29 * 10];
          fVar6 = fVar5;
          if (fVar41 <= fVar5) {
            fVar6 = fVar41;
          }
          fVar43 = fVar6;
          if ('\0' < cVar8) {
            fVar43 = fVar5;
          }
          fVar5 = local_d8[uVar29 * 10 + 1];
          fVar42 = fVar5;
          if (fVar4 <= fVar5) {
            fVar42 = fVar4;
          }
          if (cVar7 < '\x01') {
            fVar5 = fVar42;
          }
          bVar39 = (uVar29 & 1) != 0;
          if (bVar39) {
            fVar6 = fVar43;
          }
          fVar43 = *(float *)(&local_d0 + uVar29 * 5);
          if (bVar39) {
            fVar43 = (float)(~-(uint)((float)local_f8._0_4_ <= fVar43) & local_f8._0_4_ |
                            -(uint)((float)local_f8._0_4_ <= fVar43) & (uint)fVar43);
          }
          if (uVar29 < 2) {
            fVar5 = fVar42;
          }
          local_158 = *(float *)((long)&local_d0 + uVar29 * 0x28 + 4);
          if ((uVar29 >= 2) && ((table->Flags & 0x40000) == 0)) {
            local_158 = (float)((uint)local_158 & -(uint)(local_108 <= local_158) |
                               ~-(uint)(local_108 <= local_158) & (uint)local_108);
          }
          lVar25 = 0;
          do {
            local_128.Storage[lVar25] = local_128.Storage[lVar25] & ~pIVar32->Storage[lVar25];
            lVar25 = lVar25 + 1;
          } while (lVar25 != 5);
          iVar36 = iVar36 - iVar31;
          if (0 < (table->DrawSplitter)._Count) {
            fStack_dc = local_158;
            lVar25 = 0;
            lVar38 = 0;
            local_e8 = fVar6;
            fStack_e4 = fVar5;
            fStack_e0 = fVar43;
            do {
              bVar39 = ImBitArray<132>::TestBit(local_c4 + uVar29 * 2,(int)lVar38);
              if (bVar39) {
                ImBitArray<132>::ClearBit(local_c4 + uVar29 * 2,(int)lVar38);
                if ((table->DrawSplitter)._Channels.Size <= lVar38) goto LAB_002c3e21;
                pIVar27 = (table->DrawSplitter)._Channels.Data;
                if ((((*(int *)((long)&(pIVar27->_CmdBuffer).Size + lVar25) != 1) ||
                     (pfVar35 = *(float **)((long)&(pIVar27->_CmdBuffer).Data + lVar25),
                     *pfVar35 < fVar6)) || (pfVar35[1] < fVar5)) ||
                   ((fVar43 < pfVar35[2] || (local_158 < pfVar35[3])))) {
                  __assert_fail("channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                                ,0x2714,"void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *)"
                               );
                }
                iVar31 = iVar31 + -1;
                piVar28 = (int *)((long)&(pIVar27->_CmdBuffer).Size + lVar25);
                *(ulong *)pfVar35 = CONCAT44(fStack_e4,local_e8);
                *(ulong *)(pfVar35 + 2) = CONCAT44(fStack_dc,fStack_e0);
                iVar37 = *piVar28;
                iVar14 = piVar28[1];
                iVar15 = piVar28[2];
                iVar16 = piVar28[3];
                iVar17 = piVar28[5];
                iVar18 = piVar28[6];
                iVar19 = piVar28[7];
                (pIVar34->_IdxBuffer).Size = piVar28[4];
                (pIVar34->_IdxBuffer).Capacity = iVar17;
                *(int *)&(pIVar34->_IdxBuffer).Data = iVar18;
                *(int *)((long)&(pIVar34->_IdxBuffer).Data + 4) = iVar19;
                (pIVar34->_CmdBuffer).Size = iVar37;
                (pIVar34->_CmdBuffer).Capacity = iVar14;
                *(int *)&(pIVar34->_CmdBuffer).Data = iVar15;
                *(int *)((long)&(pIVar34->_CmdBuffer).Data + 4) = iVar16;
                pIVar34 = pIVar34 + 1;
              }
              lVar38 = lVar38 + 1;
            } while ((lVar38 < (table->DrawSplitter)._Count) &&
                    (lVar25 = lVar25 + 0x20, iVar31 != 0));
          }
        }
        if (uVar29 == 1 && '\0' < cVar7) {
          bVar9 = table->Bg1DrawChannelUnfrozen;
          if ((table->DrawSplitter)._Channels.Size <= (int)(uint)bVar9) goto LAB_002c3e21;
          pIVar11 = (table->DrawSplitter)._Channels.Data;
          pIVar27 = pIVar11 + bVar9;
          iVar31 = (pIVar27->_CmdBuffer).Size;
          iVar37 = (pIVar27->_CmdBuffer).Capacity;
          uVar12 = *(undefined4 *)&(pIVar27->_CmdBuffer).Data;
          uVar13 = *(undefined4 *)((long)&(pIVar27->_CmdBuffer).Data + 4);
          pIVar3 = &pIVar11[bVar9]._IdxBuffer;
          iVar14 = pIVar3->Capacity;
          uVar20 = *(undefined4 *)&pIVar3->Data;
          uVar21 = *(undefined4 *)((long)&pIVar3->Data + 4);
          (pIVar34->_IdxBuffer).Size = pIVar3->Size;
          (pIVar34->_IdxBuffer).Capacity = iVar14;
          *(undefined4 *)&(pIVar34->_IdxBuffer).Data = uVar20;
          *(undefined4 *)((long)&(pIVar34->_IdxBuffer).Data + 4) = uVar21;
          (pIVar34->_CmdBuffer).Size = iVar31;
          (pIVar34->_CmdBuffer).Capacity = iVar37;
          *(undefined4 *)&(pIVar34->_CmdBuffer).Data = uVar12;
          *(undefined4 *)((long)&(pIVar34->_CmdBuffer).Data + 4) = uVar13;
          pIVar34 = pIVar34 + 1;
        }
        uVar29 = uVar29 + 1;
        pIVar32 = pIVar32 + 2;
      } while (uVar29 != 4);
      iVar31 = (table->DrawSplitter)._Count;
      if ((0 < iVar31) && (iVar36 != 0)) {
        lVar25 = 0;
        lVar38 = 0;
        do {
          bVar39 = ImBitArray<132>::TestBit(&local_128,(int)lVar38);
          if (bVar39) {
            if ((table->DrawSplitter)._Channels.Size <= lVar38) {
LAB_002c3e21:
              __function = "T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]";
LAB_002c3e8b:
              __assert_fail("i >= 0 && i < Size",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.h"
                            ,0x688,__function);
            }
            pIVar27 = (table->DrawSplitter)._Channels.Data;
            puVar2 = (undefined8 *)((long)&(pIVar27->_CmdBuffer).Size + lVar25);
            uVar22 = *puVar2;
            pIVar10 = (ImDrawCmd *)puVar2[1];
            piVar28 = (int *)((long)&(pIVar27->_IdxBuffer).Size + lVar25);
            iVar31 = piVar28[1];
            iVar37 = piVar28[2];
            iVar14 = piVar28[3];
            (pIVar34->_IdxBuffer).Size = *piVar28;
            (pIVar34->_IdxBuffer).Capacity = iVar31;
            *(int *)&(pIVar34->_IdxBuffer).Data = iVar37;
            *(int *)((long)&(pIVar34->_IdxBuffer).Data + 4) = iVar14;
            (pIVar34->_CmdBuffer).Size = (int)uVar22;
            (pIVar34->_CmdBuffer).Capacity = (int)((ulong)uVar22 >> 0x20);
            (pIVar34->_CmdBuffer).Data = pIVar10;
            pIVar34 = pIVar34 + 1;
            iVar36 = iVar36 + -1;
          }
          lVar38 = lVar38 + 1;
          iVar31 = (table->DrawSplitter)._Count;
        } while ((lVar38 < iVar31) && (lVar25 = lVar25 + 0x20, iVar36 != 0));
      }
      pIVar27 = (pIVar23->DrawChannelsTempMergeBuffer).Data;
      if (pIVar34 != pIVar27 + (pIVar23->DrawChannelsTempMergeBuffer).Size) {
        __assert_fail("dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                      ,0x2728,"void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *)");
      }
      memcpy((table->DrawSplitter)._Channels.Data + 2,pIVar27,(long)iVar31 * 0x20 - 0x40);
    }
  }
  return;
}

Assistant:

void    ImGui::TableReorderDrawChannelsForMerge(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = &table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];
    memset(merge_groups, 0, sizeof(merge_groups));

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->VisibleUnclippedMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0)
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImU8)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0) and 1 (Bg1 frozen) from the shuffling since they won't move - see channels allocation in TableUpdateDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.ClearBits();
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count - 1);
        remaining_mask.ClearBit(table->Bg1DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg1DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG1_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, ~0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg1DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0 and Bg1 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg1DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}